

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# escaping.cc
# Opt level: O3

bool __thiscall absl::HexStringToBytes(absl *this,string_view hex,Nonnull<std::string_*> bytes)

{
  char cVar1;
  bool bVar2;
  char *pcVar3;
  char cVar4;
  char *pcVar5;
  string output;
  char *local_38;
  long local_30;
  char local_28;
  undefined7 uStack_27;
  
  pcVar5 = (char *)hex._M_len;
  local_30 = 0;
  local_28 = '\0';
  local_38 = &local_28;
  if (((ulong)this & 1) == 0) {
    std::__cxx11::string::resize((ulong)&local_38,(char)((ulong)this >> 1));
    if (local_30 == 0) {
LAB_00267dcc:
      std::__cxx11::string::operator=((string *)hex._M_str,(string *)&local_38);
      bVar2 = true;
    }
    else {
      cVar1 = (anonymous_namespace)::kHexValueStrict[*pcVar5];
      pcVar3 = local_38;
      if ((cVar1 != -1) && (cVar4 = (anonymous_namespace)::kHexValueStrict[pcVar5[1]], cVar4 != -1))
      {
        pcVar5 = pcVar5 + 3;
        do {
          *pcVar3 = cVar1 * '\x10' + cVar4;
          pcVar3 = pcVar3 + 1;
          if (pcVar3 == local_38 + local_30) goto LAB_00267dcc;
          cVar1 = (anonymous_namespace)::kHexValueStrict[pcVar5[-1]];
          if (cVar1 == -1) break;
          cVar4 = (anonymous_namespace)::kHexValueStrict[*pcVar5];
          pcVar5 = pcVar5 + 2;
        } while (cVar4 != -1);
      }
      bVar2 = false;
      std::__cxx11::string::resize((ulong)&local_38,(char)pcVar3 - (char)local_38);
    }
  }
  else {
    bVar2 = false;
  }
  if (local_38 != &local_28) {
    operator_delete(local_38,CONCAT71(uStack_27,local_28) + 1);
  }
  return bVar2;
}

Assistant:

bool HexStringToBytes(absl::string_view hex,
                      absl::Nonnull<std::string*> bytes) {
  std::string output;

  size_t num_bytes = hex.size() / 2;
  if (hex.size() != num_bytes * 2) {
    return false;
  }

  absl::strings_internal::STLStringResizeUninitialized(&output, num_bytes);
  auto hex_p = hex.cbegin();
  for (std::string::iterator bin_p = output.begin(); bin_p != output.end();
       ++bin_p) {
    int h1 = absl::kHexValueStrict[static_cast<size_t>(*hex_p++)];
    int h2 = absl::kHexValueStrict[static_cast<size_t>(*hex_p++)];
    if (h1 == -1 || h2 == -1) {
      output.resize(static_cast<size_t>(bin_p - output.begin()));
      return false;
    }
    *bin_p = static_cast<char>((h1 << 4) + h2);
  }

  *bytes = std::move(output);
  return true;
}